

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O2

void Memory::RecyclerWriteBarrierManager::ToggleBarrier(void *address,size_t bytes,bool enable)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (Js::Configuration::Global[0x2c154] == '\x01') {
    uVar3 = (ulong)address >> 0xc;
    uVar4 = (long)address + bytes + 0xfff >> 0xc;
    uVar2 = uVar3;
    if (enable) {
      for (; uVar2 < uVar4; uVar2 = uVar2 + 1) {
        cardTable[uVar2] = cardTable[uVar2] | 2;
      }
    }
    else {
      for (; uVar2 < uVar4; uVar2 = uVar2 + 1) {
        cardTable[uVar2] = cardTable[uVar2] & 0xfd;
      }
    }
    if ((Js::Configuration::Global[0x291a2] == '\x01') &&
       (bVar1 = Js::Phases::IsEnabled
                          ((Phases *)(Js::Configuration::Global + 0x23450),MemoryAllocationPhase),
       bVar1)) {
      Output::Print(L"Enabling 0x%p (CIndex: %u-%u)\n",address,uVar3,uVar4);
      return;
    }
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::ToggleBarrier(void * address, size_t bytes, bool enable)
{
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        uintptr_t startIndex = GetCardTableIndex(address);
        char * endAddress = (char *)Math::Align<INT_PTR>((INT_PTR)((char *)address + bytes), s_WriteBarrierPageSize);
        uintptr_t endIndex = GetCardTableIndex(endAddress);
        if (enable)
        {
            for (uintptr_t i = startIndex; i < endIndex; i++)
            {
                cardTable[i] |= WRITE_BARRIER_PAGE_BIT;
            }
        }
        else
        {
            for (uintptr_t i = startIndex; i < endIndex; i++)
            {
                cardTable[i] &= ~WRITE_BARRIER_PAGE_BIT;
            }
        }

        GlobalSwbVerboseTrace(_u("Enabling 0x%p (CIndex: %u-%u)\n"), address, startIndex, endIndex);
    }
}